

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

Proto * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,char *name)

{
  size_t l;
  TString *source;
  undefined1 local_2e0 [8];
  FuncState funcstate;
  LexState lexstate;
  char *name_local;
  Mbuffer *buff_local;
  ZIO *z_local;
  lua_State *L_local;
  
  l = strlen(name);
  source = luaS_newlstr(L,name,l);
  luaX_setinput(L,(LexState *)(funcstate.actvar + 0xc6),z,source);
  open_func((LexState *)(funcstate.actvar + 0xc6),(FuncState *)local_2e0);
  *(lu_byte *)((long)local_2e0 + 0x72) = '\x02';
  luaX_next((LexState *)(funcstate.actvar + 0xc6));
  chunk((LexState *)(funcstate.actvar + 0xc6));
  check((LexState *)(funcstate.actvar + 0xc6),0x11f);
  close_func((LexState *)(funcstate.actvar + 0xc6));
  return (Proto *)local_2e0;
}

Assistant:

static Proto*luaY_parser(lua_State*L,ZIO*z,Mbuffer*buff,const char*name){
struct LexState lexstate;
struct FuncState funcstate;
lexstate.buff=buff;
luaX_setinput(L,&lexstate,z,luaS_new(L,name));
open_func(&lexstate,&funcstate);
funcstate.f->is_vararg=2;
luaX_next(&lexstate);
chunk(&lexstate);
check(&lexstate,TK_EOS);
close_func(&lexstate);
return funcstate.f;
}